

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressdialog.cpp
# Opt level: O2

void __thiscall QProgressDialog::setLabel(QProgressDialog *this,QLabel *label)

{
  QProgressDialogPrivate *this_00;
  QLabel *pQVar1;
  long in_FS_OFFSET;
  char local_38 [24];
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QProgressDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  pQVar1 = this_00->label;
  if (pQVar1 == label) {
    if (label != (QLabel *)0x0) {
      local_38[0] = '\x02';
      local_38[1] = '\0';
      local_38[2] = '\0';
      local_38[3] = '\0';
      local_38[0x14] = '\0';
      local_38[0x15] = '\0';
      local_38[0x16] = '\0';
      local_38[0x17] = '\0';
      local_38[4] = '\0';
      local_38[5] = '\0';
      local_38[6] = '\0';
      local_38[7] = '\0';
      local_38[8] = '\0';
      local_38[9] = '\0';
      local_38[10] = '\0';
      local_38[0xb] = '\0';
      local_38[0xc] = '\0';
      local_38[0xd] = '\0';
      local_38[0xe] = '\0';
      local_38[0xf] = '\0';
      local_38[0x10] = '\0';
      local_38[0x11] = '\0';
      local_38[0x12] = '\0';
      local_38[0x13] = '\0';
      local_20 = "default";
      QMessageLogger::warning
                (local_38,"QProgressDialog::setLabel: Attempt to set the same label again");
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return;
    }
  }
  else {
    if (pQVar1 != (QLabel *)0x0) {
      (**(code **)(*(long *)&(pQVar1->super_QFrame).super_QWidget + 0x20))();
    }
    this_00->label = label;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QProgressDialogPrivate::adoptChildWidget(this_00,(QWidget *)label);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QProgressDialog::setLabel(QLabel *label)
{
    Q_D(QProgressDialog);
    if (label == d->label) {
        if (Q_UNLIKELY(label))
            qWarning("QProgressDialog::setLabel: Attempt to set the same label again");
        return;
    }
    delete d->label;
    d->label = label;
    d->adoptChildWidget(label);
}